

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::BindRayGenShader
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,char *pShaderGroupName,
          void *pData,Uint32 DataSize)

{
  uint uVar1;
  Char *pCVar2;
  PipelineStateVkImpl *this_00;
  uchar *puVar3;
  RenderDeviceVkImpl *this_01;
  GraphicsAdapterInfo *pGVar4;
  value_type_conflict4 local_79;
  Uint32 GroupSize;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  Uint32 DataSize_local;
  void *pData_local;
  char *pShaderGroupName_local;
  ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = DataSize;
  if ((pData == (void *)0x0) != (DataSize == 0)) {
    FormatString<char[26],char[38]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) == (DataSize == 0)",
               (char (*) [38])(ulong)(DataSize == 0));
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"BindRayGenShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x90);
    std::__cxx11::string::~string((string *)local_48);
  }
  if ((pData != (void *)0x0) && (msg.field_2._12_4_ != this->m_ShaderRecordSize)) {
    FormatString<char[26],char[61]>
              ((string *)&GroupSize,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) || (DataSize == this->m_ShaderRecordSize)",
               (char (*) [61])this);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"BindRayGenShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x91);
    std::__cxx11::string::~string((string *)&GroupSize);
  }
  local_79 = 0xa7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_RayGenShaderRecord,(ulong)this->m_ShaderRecordStride,&local_79);
  this_00 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPSO);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&this->m_RayGenShaderRecord);
  PipelineStateBase<Diligent::EngineVkImplTraits>::CopyShaderHandle
            (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>,pShaderGroupName,puVar3
             ,(ulong)this->m_ShaderRecordStride);
  this_01 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                       );
  pGVar4 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_01);
  uVar1 = (pGVar4->RayTracing).ShaderGroupHandleSize;
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&this->m_RayGenShaderRecord);
  memcpy(puVar3 + uVar1,pData,(ulong)(uint)msg.field_2._12_4_);
  this->m_Changed = true;
  return;
}

Assistant:

BindRayGenShader(const char* pShaderGroupName, const void* pData, Uint32 DataSize) override final
    {
        VERIFY_EXPR((pData == nullptr) == (DataSize == 0));
        VERIFY_EXPR((pData == nullptr) || (DataSize == this->m_ShaderRecordSize));

        this->m_RayGenShaderRecord.resize(this->m_ShaderRecordStride, Uint8{EmptyElem});
        this->m_pPSO->CopyShaderHandle(pShaderGroupName, this->m_RayGenShaderRecord.data(), this->m_ShaderRecordStride);

        const Uint32 GroupSize = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupHandleSize;
        std::memcpy(this->m_RayGenShaderRecord.data() + GroupSize, pData, DataSize);
        this->m_Changed = true;
    }